

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

bool __thiscall
FIX::double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  uint64_t uVar1;
  ulong uVar2;
  char *pcVar3;
  byte bVar4;
  undefined4 in_register_0000000c;
  double *number_of_read_digits;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int requested_exponent;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  DiyFp diy_fp;
  DiyFp cached_power;
  DiyFp local_58;
  int cached_decimal_exponent;
  int read_digits;
  int local_38;
  
  number_of_read_digits = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar8 = (uint)trimmed.start_;
  if (uVar8 == 0) goto LAB_00181716;
  uVar10 = trimmed.length_;
  if (0x135 < (int)(uVar10 + uVar8)) {
    *number_of_read_digits = INFINITY;
    return true;
  }
  if ((int)(uVar10 + uVar8) < -0x143) goto LAB_00181716;
  if ((int)uVar8 < 0x10) {
    if (-1 < (int)uVar10) {
      if (uVar10 < 0x17) {
        buffer.start_ = (char *)(ulong)uVar8;
        buffer._8_8_ = &cached_power;
        uVar1 = ReadUint64(this,buffer,(int *)number_of_read_digits);
        auVar13._8_4_ = (int)(uVar1 >> 0x20);
        auVar13._0_8_ = uVar1;
        auVar13._12_4_ = 0x45300000;
        dVar12 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        *number_of_read_digits = dVar12;
        if ((uint)cached_power.f_ != uVar8) {
          __assert_fail("read_digits == trimmed.length()",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                        ,0xe3,
                        "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)"
                       );
        }
        uVar2 = (ulong)uVar10;
      }
      else {
        iVar6 = uVar10 - (0xf - uVar8);
        if (0x16 < iVar6) goto LAB_0018168c;
        buffer_01.start_ = (char *)(ulong)uVar8;
        buffer_01._8_8_ = &cached_power;
        uVar1 = ReadUint64(this,buffer_01,(int *)number_of_read_digits);
        auVar15._8_4_ = (int)(uVar1 >> 0x20);
        auVar15._0_8_ = uVar1;
        auVar15._12_4_ = 0x45300000;
        dVar12 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        *number_of_read_digits = dVar12;
        if ((uint)cached_power.f_ != uVar8) {
          __assert_fail("read_digits == trimmed.length()",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                        ,0xef,
                        "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)"
                       );
        }
        dVar12 = dVar12 * *(double *)(exact_powers_of_ten + (ulong)(0xf - uVar8) * 8);
        uVar2 = (ulong)iVar6;
      }
      dVar12 = dVar12 * *(double *)(exact_powers_of_ten + uVar2 * 8);
LAB_00181683:
      *number_of_read_digits = dVar12;
      return true;
    }
    if (0xffffffe9 < uVar10) {
      buffer_00.start_ = (char *)(ulong)uVar8;
      buffer_00._8_8_ = &cached_power;
      uVar1 = ReadUint64(this,buffer_00,(int *)number_of_read_digits);
      auVar14._8_4_ = (int)(uVar1 >> 0x20);
      auVar14._0_8_ = uVar1;
      auVar14._12_4_ = 0x45300000;
      dVar12 = (auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      *number_of_read_digits = dVar12;
      if ((uint)cached_power.f_ != uVar8) {
        __assert_fail("read_digits == trimmed.length()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xdc,
                      "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)"
                     );
      }
      dVar12 = dVar12 / *(double *)(exact_powers_of_ten + (ulong)-uVar10 * 8);
      goto LAB_00181683;
    }
  }
LAB_0018168c:
  buffer_02.start_ = (char *)(ulong)uVar8;
  buffer_02._8_8_ = &read_digits;
  cached_power.f_ = (uint64_t)this;
  cached_power.e_ = uVar8;
  local_58.f_ = ReadUint64(this,buffer_02,(int *)number_of_read_digits);
  iVar6 = read_digits;
  if (read_digits == uVar8) {
    iVar6 = 0;
  }
  else {
    pcVar3 = Vector<const_char>::operator[]((Vector<const_char> *)&cached_power,read_digits);
    local_58.f_ = local_58.f_ + ('4' < *pcVar3);
    iVar6 = cached_power.e_ - iVar6;
  }
  local_58.e_ = 0;
  requested_exponent = uVar10 + iVar6;
  DiyFp::Normalize(&local_58);
  lVar7 = ((ulong)(iVar6 != 0) << 2) << (-(char)local_58.e_ & 0x3fU);
  if (0x154 < requested_exponent) {
    __assert_fail("exponent <= PowersOfTenCache::kMaxDecimalExponent",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                  ,0x129,
                  "bool FIX::double_conversion::DiyFpStrtod(Vector<const char>, int, double *)");
  }
  if (-0x15d < requested_exponent) {
    cached_power.f_ = 0;
    cached_power.e_ = 0;
    PowersOfTenCache::GetCachedPowerForDecimalExponent
              (requested_exponent,&cached_power,&cached_decimal_exponent);
    uVar10 = requested_exponent - cached_decimal_exponent;
    if (uVar10 != 0) {
      if (uVar10 == 0 || requested_exponent < cached_decimal_exponent) {
        __assert_fail("0 < exponent",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xfc,"DiyFp FIX::double_conversion::AdjustmentPowerOfTen(int)");
      }
      if (7 < uVar10) {
        __assert_fail("exponent < PowersOfTenCache::kDecimalExponentDistance",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xfd,"DiyFp FIX::double_conversion::AdjustmentPowerOfTen(int)");
      }
      local_38 = *(int *)(&DAT_001c6544 + (long)(int)uVar10 * 4);
      _read_digits = *(uint64_t *)(&DAT_001c6560 + (long)(int)uVar10 * 8);
      DiyFp::Multiply(&local_58,(DiyFp *)&read_digits);
      if ((int)(0x13 - uVar8) < (int)uVar10) {
        lVar7 = lVar7 + 4;
      }
    }
    DiyFp::Multiply(&local_58,&cached_power);
    iVar6 = local_58.e_;
    DiyFp::Normalize(&local_58);
    uVar11 = (9 - (ulong)(lVar7 == 0)) + lVar7 << ((char)iVar6 - (char)local_58.e_ & 0x3fU);
    uVar2 = 0;
    if (0xfffffbce < local_58.e_ + 0x40U) {
      uVar2 = (ulong)(local_58.e_ + 0x472);
    }
    uVar5 = 0x35;
    if (local_58.e_ < -0x43d) {
      uVar5 = uVar2;
    }
    iVar6 = (int)uVar5;
    if (iVar6 < 4) {
      bVar4 = (byte)(4 - iVar6);
      local_58.f_ = local_58.f_ >> (bVar4 & 0x3f);
      local_58.e_ = (4 - iVar6) + local_58.e_;
      uVar5 = (ulong)(uint)local_58.e_;
      uVar11 = (uVar11 >> (bVar4 & 0x3f)) + 9;
      iVar6 = 0x3c;
    }
    else {
      iVar6 = 0x40 - iVar6;
    }
    bVar4 = (byte)iVar6;
    uVar9 = (~(-1L << (bVar4 & 0x3f)) & local_58.f_) << 3;
    lVar7 = 8L << (bVar4 - 1 & 0x3f);
    diy_fp.f_ = (ulong)(uint)(local_58.e_ + iVar6);
    uVar2 = uVar11 + lVar7;
    diy_fp._8_8_ = uVar5;
    dVar12 = (double)Double::DiyFpToUint64
                               ((Double *)
                                (((local_58.f_ >> (bVar4 & 0x3f)) + 1) - (ulong)(uVar9 < uVar2)),
                                diy_fp);
    *number_of_read_digits = dVar12;
    if (lVar7 - uVar11 < uVar9) {
      if (uVar9 < uVar2) {
        return INFINITY <= dVar12;
      }
      return true;
    }
    return true;
  }
LAB_00181716:
  *number_of_read_digits = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}